

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86_avx::forward_int8
          (Gemm_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  pointer pMVar2;
  Mat *pMVar3;
  Mat *A;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float max_kk;
  int iVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  int iVar31;
  int *piVar32;
  bool bVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  uint local_36c;
  float B_int8_scale;
  int TILE_K;
  ulong local_348;
  ulong local_340;
  ulong local_338;
  ulong local_320;
  Mat m_3;
  Mat m_1;
  Mat local_278;
  int TILE_K_2;
  Mat local_228;
  Mat m;
  Mat local_188;
  ulong local_138;
  ulong local_130;
  Mat *local_128;
  Mat m_2;
  float B_int8_scale_1;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int local_7c;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  iVar31 = (this->super_Gemm).constantA;
  iVar18 = (this->super_Gemm).constantB;
  if (iVar18 != 0 && iVar31 != 0) {
    uVar28 = (this->super_Gemm).constantM;
LAB_0047bed0:
    uVar25 = (this->super_Gemm).constantN;
  }
  else {
    pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar31 == 0) {
      iVar16 = (this->super_Gemm).transA;
      if (iVar18 != 0) {
        if (iVar16 == 0) {
          uVar28 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
        }
        else {
          uVar28 = pMVar2->w;
        }
        goto LAB_0047bed0;
      }
      if (iVar16 == 0) {
        uVar28 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
      }
      else {
        uVar28 = pMVar2->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar2[1].w;
      }
      else {
        uVar25 = pMVar2[1].elempack * (&pMVar2[1].h)[(ulong)(pMVar2[1].dims == 3) * 2];
      }
    }
    else {
      uVar28 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar2->w;
      }
      else {
        uVar25 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
      }
    }
  }
  local_278.cstep = 0;
  uVar34 = 0;
  uVar35 = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar23 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar2;
    if (iVar18 != 0 && iVar31 != 0) {
      bVar33 = true;
      if (lVar23 == 0x48) {
        local_278.data = pMVar2->data;
        piVar32 = pMVar2->refcount;
        sVar20 = pMVar2->elemsize;
        local_278.elempack = pMVar2->elempack;
        local_278.allocator = pMVar2->allocator;
        uVar34._0_4_ = pMVar2->dims;
        uVar34._4_4_ = pMVar2->w;
        uVar35._0_4_ = pMVar2->h;
        uVar35._4_4_ = pMVar2->d;
        local_278.c = pMVar2->c;
        local_278.cstep = pMVar2->cstep;
        if (piVar32 == (int *)0x0) {
          piVar32 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar20 = 0;
        piVar32 = (int *)0x0;
        local_278.data = (void *)0x0;
        local_278.c = 0;
        local_278.cstep = 0;
      }
      local_278.refcount._0_4_ = SUB84(piVar32,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_278.elemsize._0_4_ = (undefined4)sVar20;
      local_278.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
      local_278.dims = (int)uVar34;
      local_278.w = (int)((ulong)uVar34 >> 0x20);
      local_278.h = (int)uVar35;
      local_278.d = (int)((ulong)uVar35 >> 0x20);
      if (!bVar33) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_278.allocator == (Allocator *)0x0) goto LAB_0047de38;
          (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
        }
      }
    }
    else if (iVar31 == 0) {
      if (iVar18 == 0) {
        bVar33 = true;
        if (lVar23 == 0xd8) {
          local_278.data = pMVar2[2].data;
          piVar32 = pMVar2[2].refcount;
          sVar20 = pMVar2[2].elemsize;
          local_278.elempack = pMVar2[2].elempack;
          local_278.allocator = pMVar2[2].allocator;
          uVar34._0_4_ = pMVar2[2].dims;
          uVar34._4_4_ = pMVar2[2].w;
          uVar35._0_4_ = pMVar2[2].h;
          uVar35._4_4_ = pMVar2[2].d;
          local_278.c = pMVar2[2].c;
          local_278.cstep = pMVar2[2].cstep;
          if (piVar32 == (int *)0x0) {
            piVar32 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar20 = 0;
          piVar32 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar32,0);
        local_278.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_278.elemsize._0_4_ = (undefined4)sVar20;
        local_278.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
        local_278.dims = (int)uVar34;
        local_278.w = (int)((ulong)uVar34 >> 0x20);
        local_278.h = (int)uVar35;
        local_278.d = (int)((ulong)uVar35 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_0047de38;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
      else {
        bVar33 = true;
        if (lVar23 == 0x90) {
          local_278.data = pMVar2[1].data;
          piVar32 = pMVar2[1].refcount;
          sVar20 = pMVar2[1].elemsize;
          local_278.elempack = pMVar2[1].elempack;
          local_278.allocator = pMVar2[1].allocator;
          uVar34._0_4_ = pMVar2[1].dims;
          uVar34._4_4_ = pMVar2[1].w;
          uVar35._0_4_ = pMVar2[1].h;
          uVar35._4_4_ = pMVar2[1].d;
          local_278.c = pMVar2[1].c;
          local_278.cstep = pMVar2[1].cstep;
          if (piVar32 == (int *)0x0) {
            piVar32 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar20 = 0;
          piVar32 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar32,0);
        local_278.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_278.elemsize._0_4_ = (undefined4)sVar20;
        local_278.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
        local_278.dims = (int)uVar34;
        local_278.w = (int)((ulong)uVar34 >> 0x20);
        local_278.h = (int)uVar35;
        local_278.d = (int)((ulong)uVar35 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_278.allocator == (Allocator *)0x0) {
LAB_0047de38:
              free(local_278.data);
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
            }
          }
        }
      }
    }
    else {
      bVar33 = true;
      if (lVar23 == 0x90) {
        local_278.data = pMVar2[1].data;
        piVar32 = pMVar2[1].refcount;
        sVar20 = pMVar2[1].elemsize;
        local_278.elempack = pMVar2[1].elempack;
        local_278.allocator = pMVar2[1].allocator;
        uVar34._0_4_ = pMVar2[1].dims;
        uVar34._4_4_ = pMVar2[1].w;
        uVar35._0_4_ = pMVar2[1].h;
        uVar35._4_4_ = pMVar2[1].d;
        local_278.c = pMVar2[1].c;
        local_278.cstep = pMVar2[1].cstep;
        if (piVar32 == (int *)0x0) {
          piVar32 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_278.cstep = 0;
        local_278.c = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar20 = 0;
        piVar32 = (int *)0x0;
        local_278.data = (void *)0x0;
      }
      local_278.refcount._0_4_ = SUB84(piVar32,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_278.elemsize._0_4_ = (undefined4)sVar20;
      local_278.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
      local_278.dims = (int)uVar34;
      local_278.w = (int)((ulong)uVar34 >> 0x20);
      local_278.h = (int)uVar35;
      local_278.d = (int)((ulong)uVar35 >> 0x20);
      if (!bVar33) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_278.allocator == (Allocator *)0x0) goto LAB_0047de38;
          (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
        }
      }
    }
    local_36c = 0;
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      if (local_278.dims == 1) {
        local_36c = (uint)(local_278.w * local_278.elempack == uVar28);
        bVar33 = local_278.w * local_278.elempack == uVar25;
      }
      else {
        bVar33 = local_278.dims != 2;
        local_36c = 0;
        if (local_278.w == 1U && !bVar33) {
          local_36c = (uint)(local_278.elempack * local_278.h == uVar28) * 2;
        }
        if (((local_278.w != 1U || bVar33) && bVar33) || (local_278.w != uVar25)) goto LAB_0047c296;
        if (local_278.elempack * local_278.h == uVar28) {
          local_36c = 3;
        }
        bVar33 = local_278.elempack * local_278.h == 1;
      }
      if (bVar33) {
        local_36c = 4;
      }
    }
  }
  else {
    if (&local_278 != &this->CT_data) {
      piVar32 = (this->CT_data).refcount;
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      local_278.data = (this->CT_data).data;
      piVar32 = (this->CT_data).refcount;
      local_278.refcount._0_4_ = SUB84(piVar32,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      sVar20 = (this->CT_data).elemsize;
      local_278.elemsize._0_4_ = (undefined4)sVar20;
      local_278.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
      local_278.elempack = (this->CT_data).elempack;
      local_278.allocator = (this->CT_data).allocator;
      uVar5 = (this->CT_data).dims;
      uVar6 = (this->CT_data).w;
      uVar7 = (this->CT_data).h;
      uVar8 = (this->CT_data).d;
      local_278.c = (this->CT_data).c;
      local_278.cstep = (this->CT_data).cstep;
      local_278.dims = uVar5;
      local_278.w = uVar6;
      local_278.h = uVar7;
      local_278.d = uVar8;
    }
    local_36c = (this->super_Gemm).constant_broadcast_type_C;
  }
LAB_0047c296:
  iVar31 = (this->super_Gemm).output_transpose;
  if (opt->use_packing_layout == true) {
    uVar29 = uVar25;
    if (iVar31 == 0) {
      uVar29 = uVar28;
    }
    iVar18 = 8;
    if ((uVar29 & 7) != 0) {
      iVar18 = (uint)((uVar29 & 3) == 0) * 3 + 1;
    }
  }
  else {
    iVar18 = 1;
  }
  iVar16 = (this->super_Gemm).output_elempack;
  if (iVar16 != 0) {
    iVar18 = iVar16;
  }
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar29 = uVar25;
  if (iVar31 != 0) {
    uVar29 = uVar28;
    uVar28 = uVar25;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(pMVar3,uVar29,(int)uVar28 / iVar18,(ulong)(uint)(iVar18 * 4),iVar18,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar3,uVar29,1,(int)uVar28 / iVar18,(ulong)(uint)(iVar18 * 4),iVar18,
                opt->blob_allocator);
  }
  iVar31 = -100;
  if ((pMVar3->data == (void *)0x0) || ((long)pMVar3->c * pMVar3->cstep == 0)) goto LAB_0047ed8d;
  uVar28 = *(uint *)&(this->super_Gemm).field_0x244;
  uVar25 = uVar28;
  if (uVar28 == 0) {
    uVar25 = opt->num_threads;
  }
  local_348 = (ulong)uVar25;
  if (opt->num_threads != uVar28 && uVar28 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  iVar31 = (this->super_Gemm).constantA;
  iVar18 = (this->super_Gemm).constantB;
  iVar16 = (int)local_348;
  if (iVar18 == 0 || iVar31 == 0) {
    A = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
    if (iVar31 == 0) {
      if (iVar18 == 0) {
        iVar18 = (this->super_Gemm).transA;
        iVar13 = (this->super_Gemm).transB;
        if (iVar18 == 0) {
          iVar17 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
          iVar19 = A->w;
        }
        else {
          iVar17 = A->w;
          iVar19 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        if (iVar13 == 0) {
          iVar11 = A[1].w;
        }
        else {
          iVar11 = A[1].elempack * (&A[1].h)[(ulong)(A[1].dims == 3) * 2];
        }
        iVar26 = (this->super_Gemm).output_transpose;
        fVar1 = (this->super_Gemm).alpha;
        local_320 = CONCAT44(local_320._4_4_,(this->super_Gemm).beta);
        local_128 = pMVar3;
        get_optimal_tile_mnk_int8
                  (iVar17,iVar11,iVar19,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_K,
                   (int *)&B_int8_scale,&TILE_K_2,iVar16);
        iVar12 = TILE_K_2;
        iVar31 = TILE_K;
        fVar10 = B_int8_scale;
        local_340 = CONCAT44(local_340._4_4_,(iVar17 + TILE_K + -1) / TILE_K);
        iVar16 = (iVar11 + (int)B_int8_scale + -1) / (int)B_int8_scale;
        iVar24 = (TILE_K_2 + iVar19 + -1) / TILE_K_2;
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        if (TILE_K_2 < 4) {
LAB_0047d732:
          Mat::create(&local_228,iVar31 * iVar12,iVar24,(int)local_348,1,opt->workspace_allocator);
        }
        else {
          iVar27 = cpu_support_x86_avx512_vnni();
          bVar33 = true;
          if (iVar27 == 0) {
            iVar27 = cpu_support_x86_avx_vnni();
            bVar33 = iVar27 != 0;
          }
          iVar27 = cpu_support_x86_avx_vnni_int8();
          if (!(bool)(bVar33 & iVar27 == 0)) goto LAB_0047d732;
          if (iVar31 < 0x10) {
            if (iVar31 < 8) {
              if (iVar31 < 4) {
                iVar27 = (uint)(1 < iVar31) * 4 + 4;
              }
              else {
                iVar27 = 0x10;
              }
            }
            else {
              iVar27 = 0x20;
            }
          }
          else {
            iVar27 = 0x40;
          }
          Mat::create(&local_228,(iVar27 + iVar12) * iVar31,iVar24,(int)local_348,1,
                      opt->workspace_allocator);
        }
        iVar31 = -100;
        if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
          local_188.cstep = 0;
          local_188.data = (void *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          Mat::create(&local_188,iVar12 * (int)fVar10,iVar24,iVar16,1,opt->workspace_allocator);
          iVar31 = -100;
          if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            Mat::create(&m_3,iVar17,4,opt->workspace_allocator);
            iVar31 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              pMVar3 = A + 1;
              compute_B_int8_scale(pMVar3,&B_int8_scale_1);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,iVar17,4,opt->workspace_allocator);
              iVar31 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                iVar16 = iVar24 * iVar16;
                iVar31 = 0;
                if (iVar16 < 1) {
                  iVar16 = iVar31;
                }
                for (; iVar16 != iVar31; iVar31 = iVar31 + 1) {
                  iVar17 = (int)B_int8_scale * (iVar31 / iVar24);
                  iVar12 = TILE_K_2 * (int)((long)iVar31 % (long)iVar24);
                  fVar10 = (float)(iVar11 - iVar17);
                  if ((int)B_int8_scale < iVar11 - iVar17) {
                    fVar10 = B_int8_scale;
                  }
                  iVar27 = iVar19 - iVar12;
                  if (TILE_K_2 < iVar19 - iVar12) {
                    iVar27 = TILE_K_2;
                  }
                  m_1.cstep = (size_t)local_188.w;
                  m_1.data = (void *)((long)local_188.data +
                                     ((long)iVar31 % (long)iVar24 & 0xffffffffU) * m_1.cstep *
                                     CONCAT44(local_188.elemsize._4_4_,
                                              (undefined4)local_188.elemsize) +
                                     (long)(iVar31 / iVar24) * local_188.cstep *
                                     CONCAT44(local_188.elemsize._4_4_,
                                              (undefined4)local_188.elemsize));
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)local_188.elemsize;
                  m_1.elemsize._4_4_ = local_188.elemsize._4_4_;
                  m_1.elempack = local_188.elempack;
                  m_1.allocator = local_188.allocator;
                  m_1.dims = 2;
                  m_1.w = local_188.w;
                  m_1.h = 1;
                  m_1.d = 1;
                  m_1.c = 1;
                  if (iVar13 == 0) {
                    transpose_pack_B_tile_quantize
                              (pMVar3,&m_1,iVar17,(int)fVar10,iVar12,iVar27,B_int8_scale_1);
                  }
                  else {
                    pack_B_tile_quantize
                              (pMVar3,&m_1,iVar17,(int)fVar10,iVar12,iVar27,B_int8_scale_1);
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.allocator = (Allocator *)0x0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                Mat::create(&m_1,TILE_K * (int)B_int8_scale,1,(int)local_348,4,
                            opt->workspace_allocator);
                iVar31 = -100;
                if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
                  iVar31 = (int)local_340;
                  if ((int)local_340 < 1) {
                    iVar31 = 0;
                  }
                  local_340 = CONCAT44(local_340._4_4_,iVar31);
                  iVar16 = 0;
                  local_338 = CONCAT44(local_338._4_4_,TILE_K_2);
                  while( true ) {
                    iVar31 = 0;
                    if (iVar16 == (int)local_340) break;
                    local_130 = CONCAT44(local_130._4_4_,iVar16);
                    if (iVar18 == 0) {
                      iVar31 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                      iVar13 = A->w;
                    }
                    else {
                      iVar31 = A->w;
                      iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    }
                    iVar16 = iVar16 * TILE_K;
                    iVar17 = iVar31 - iVar16;
                    if (TILE_K < iVar31 - iVar16) {
                      iVar17 = TILE_K;
                    }
                    iVar31 = get_omp_thread_num();
                    m_2.elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                    m_2.data = (void *)((long)iVar31 * m_1.cstep * m_2.elemsize + (long)m_1.data);
                    m_2.refcount = (int *)0x0;
                    m_2.elempack = m_1.elempack;
                    m_2.allocator = m_1.allocator;
                    m_2.w = m_1.w;
                    m_2.d = 1;
                    m_2.h = m_1.h;
                    m_2.c = m_1.d;
                    m_2.dims = m_1.dims + -1;
                    m_2.cstep = (m_2.elemsize * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0
                                ) / m_2.elemsize;
                    if (m_1.dims == 4) {
                      m_2.cstep = (long)m_1.h * (long)m_1.w;
                    }
                    iVar31 = (int)local_338;
                    for (iVar19 = 0; fVar10 = (float)(iVar11 - iVar19),
                        fVar10 != 0.0 && iVar19 <= iVar11; iVar19 = iVar19 + (int)B_int8_scale) {
                      if ((int)B_int8_scale < (int)fVar10) {
                        fVar10 = B_int8_scale;
                      }
                      iVar12 = iVar13;
                      for (iVar24 = 0; iVar24 < iVar13; iVar24 = iVar24 + iVar31) {
                        iVar27 = iVar12;
                        if (iVar31 < iVar12) {
                          iVar27 = iVar31;
                        }
                        iVar9 = get_omp_thread_num();
                        local_b8 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize)
                        ;
                        local_88 = (size_t)local_228.w;
                        _TILE_M = (void *)((long)local_228.data +
                                          local_b8 * local_88 * (long)(iVar24 / iVar31) +
                                          (long)iVar9 * local_228.cstep * local_b8);
                        local_c0 = (int *)0x0;
                        local_b0 = local_228.elempack;
                        local_a8 = local_228.allocator;
                        local_a0 = 2;
                        local_9c = local_228.w;
                        local_98._0_4_ = 1;
                        local_98._4_4_ = 1;
                        local_90 = 1;
                        local_68 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
                        ;
                        local_38 = (size_t)local_188.w;
                        _TILE_N = (void *)((long)local_188.data +
                                          local_38 * local_68 * (long)(iVar24 / iVar31) +
                                          (long)(iVar19 / (int)B_int8_scale) * local_188.cstep *
                                          local_68);
                        local_70 = (int *)0x0;
                        local_60 = local_188.elempack;
                        local_58 = local_188.allocator;
                        local_4c = local_188.w;
                        local_48._0_4_ = 1;
                        local_48._4_4_ = 1;
                        local_50 = local_a0;
                        local_40 = local_90;
                        if (iVar19 == 0) {
                          if (iVar24 == 0) {
                            if (iVar18 != 0) {
                              transpose_compute_A_tile_int8_scales
                                        (A,&m_3,B_int8_scale_1,&m,iVar16,iVar17);
                              goto LAB_0047e34e;
                            }
                            compute_A_tile_int8_scales(A,&m_3,B_int8_scale_1,&m,iVar16,iVar17);
                          }
                          else if (iVar18 != 0) {
LAB_0047e34e:
                            transpose_pack_A_tile_quantize
                                      (A,(Mat *)&TILE_M,iVar16,iVar17,iVar24,iVar27,&m_3);
                            goto LAB_0047e3ce;
                          }
                          pack_A_tile_quantize(A,(Mat *)&TILE_M,iVar16,iVar17,iVar24,iVar27,&m_3);
                        }
LAB_0047e3ce:
                        gemm_transB_packed_tile_int8
                                  ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar16,iVar17,iVar19,
                                   (int)fVar10,iVar24,iVar27);
                        iVar31 = (int)local_338;
                        if (local_70 != (int *)0x0) {
                          LOCK();
                          *local_70 = *local_70 + -1;
                          UNLOCK();
                          if (*local_70 == 0) {
                            if (local_58 == (Allocator *)0x0) {
                              free(_TILE_N);
                            }
                            else {
                              (*local_58->_vptr_Allocator[3])();
                            }
                          }
                        }
                        if (local_c0 != (int *)0x0) {
                          LOCK();
                          *local_c0 = *local_c0 + -1;
                          UNLOCK();
                          if (*local_c0 == 0) {
                            if (local_a8 == (Allocator *)0x0) {
                              free(_TILE_M);
                            }
                            else {
                              (*local_a8->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar12 = iVar12 - iVar31;
                      }
                      unpack_output_tile_dequantize
                                (&m_2,&local_278,local_128,local_36c,iVar16,iVar17,iVar19,
                                 (int)fVar10,&m,fVar1,(float)local_320,iVar26);
                    }
                    if (m_2.refcount != (int *)0x0) {
                      LOCK();
                      *m_2.refcount = *m_2.refcount + -1;
                      UNLOCK();
                      if (*m_2.refcount == 0) {
                        if (m_2.allocator == (Allocator *)0x0) {
                          free(m_2.data);
                        }
                        else {
                          (*(m_2.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar16 = (int)(float)local_130 + 1;
                  }
                }
                piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar32 != (int *)0x0) {
                  LOCK();
                  *piVar32 = *piVar32 + -1;
                  UNLOCK();
                  if (*piVar32 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      free(m_1.data);
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar32 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                free(local_188.data);
              }
              else {
                (*(local_188.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar32 == (int *)0x0) goto LAB_0047ed8d;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0047ed8d;
        if (local_228.allocator != (Allocator *)0x0) {
          (*(local_228.allocator)->_vptr_Allocator[3])();
          goto LAB_0047ed8d;
        }
      }
      else {
        iVar31 = (this->super_Gemm).constantN;
        local_320 = CONCAT44(local_320._4_4_,iVar31);
        iVar18 = (this->super_Gemm).constantK;
        iVar13 = (this->super_Gemm).transA;
        if (iVar13 == 0) {
          iVar17 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        else {
          iVar17 = A->w;
        }
        fVar1 = (this->super_Gemm).B_data_int8_scale;
        local_340 = (ulong)(uint)(this->super_Gemm).output_transpose;
        local_130 = CONCAT44(local_130._4_4_,(this->super_Gemm).alpha);
        fVar10 = (this->super_Gemm).beta;
        local_128 = pMVar3;
        get_optimal_tile_mnk_int8
                  (iVar17,iVar31,iVar18,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_N,
                   &TILE_K,(int *)&B_int8_scale,iVar16);
        local_138 = (ulong)_TILE_N & 0xffffffff;
        iVar16 = (iVar17 + TILE_N + -1) / TILE_N;
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        Mat::create(&local_228,iVar17,4,opt->workspace_allocator);
        iVar31 = -100;
        if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
          local_188.cstep = 0;
          local_188.data = (void *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          Mat::create(&local_188,iVar17,4,opt->workspace_allocator);
          iVar31 = -100;
          if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            if ((int)B_int8_scale < 4) {
LAB_0047d894:
              Mat::create(&m_3,(int)B_int8_scale * (int)local_138,
                          (iVar18 + (int)B_int8_scale + -1) / (int)B_int8_scale,(int)local_348,1,
                          opt->workspace_allocator);
            }
            else {
              iVar31 = cpu_support_x86_avx512_vnni();
              bVar33 = true;
              if (iVar31 == 0) {
                iVar31 = cpu_support_x86_avx_vnni();
                bVar33 = iVar31 != 0;
              }
              iVar31 = cpu_support_x86_avx_vnni_int8();
              if (!(bool)(bVar33 & iVar31 == 0)) goto LAB_0047d894;
              iVar31 = (int)local_138;
              if (iVar31 < 0x10) {
                if (iVar31 < 8) {
                  if (iVar31 < 4) {
                    iVar17 = (uint)(1 < iVar31) * 4 + 4;
                  }
                  else {
                    iVar17 = 0x10;
                  }
                }
                else {
                  iVar17 = 0x20;
                }
              }
              else {
                iVar17 = 0x40;
              }
              Mat::create(&m_3,(iVar17 + (int)B_int8_scale) * iVar31,
                          (iVar18 + (int)B_int8_scale + -1) / (int)B_int8_scale,(int)local_348,1,
                          opt->workspace_allocator);
            }
            iVar31 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              local_338 = CONCAT44(local_338._4_4_,TILE_K);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,TILE_K * (int)local_138,1,(int)local_348,4,opt->workspace_allocator);
              iVar31 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                if (iVar16 < 1) {
                  iVar16 = 0;
                }
                iVar18 = 0;
                local_7c = iVar16;
                while (iVar31 = 0, iVar18 != local_7c) {
                  local_348 = CONCAT44(local_348._4_4_,iVar18);
                  if (iVar13 == 0) {
                    iVar31 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    fVar14 = (float)A->w;
                  }
                  else {
                    iVar31 = A->w;
                    fVar14 = (float)(A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2]);
                  }
                  iVar17 = (int)local_138;
                  iVar18 = iVar18 * iVar17;
                  iVar16 = iVar31 - iVar18;
                  if (iVar17 < iVar31 - iVar18) {
                    iVar16 = iVar17;
                  }
                  iVar31 = get_omp_thread_num();
                  uVar15 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)((long)iVar31 * m.cstep * uVar15 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar15 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar15;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  iVar31 = 0;
                  while( true ) {
                    iVar17 = (int)(float)local_320 - iVar31;
                    if (iVar17 == 0 || (int)(float)local_320 < iVar31) break;
                    if ((int)local_338 < iVar17) {
                      iVar17 = (int)local_338;
                    }
                    fVar30 = fVar14;
                    for (iVar19 = 0; iVar19 < (int)fVar14; iVar19 = iVar19 + (int)B_int8_scale) {
                      max_kk = fVar30;
                      if ((int)B_int8_scale < (int)fVar30) {
                        max_kk = B_int8_scale;
                      }
                      iVar11 = get_omp_thread_num();
                      m_2.elemsize = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                      m_2.cstep = (size_t)m_3.w;
                      m_2.data = (void *)((long)m_3.data +
                                         m_2.elemsize * m_2.cstep *
                                         (long)(iVar19 / (int)B_int8_scale) +
                                         (long)iVar11 * m_3.cstep * m_2.elemsize);
                      m_2.refcount = (int *)0x0;
                      m_2.elempack = m_3.elempack;
                      m_2.allocator = m_3.allocator;
                      m_2.dims = 2;
                      m_2.w = m_3.w;
                      m_2.h = 1;
                      m_2.d = 1;
                      m_2.c = 1;
                      local_b8 = (this->BT_data).elemsize;
                      local_9c = (this->BT_data).w;
                      local_88 = (size_t)local_9c;
                      local_b0 = (this->BT_data).elempack;
                      local_a8 = (this->BT_data).allocator;
                      local_c0 = (int *)0x0;
                      _TILE_M = (void *)((long)(this->BT_data).data +
                                        local_88 * local_b8 * (long)(iVar19 / (int)B_int8_scale) +
                                        (long)(iVar31 / (int)local_338) * (this->BT_data).cstep *
                                        local_b8);
                      local_98._0_4_ = 1;
                      local_98._4_4_ = 1;
                      local_a0 = m_2.dims;
                      local_90 = m_2.c;
                      if (iVar31 == 0) {
                        if (iVar19 == 0) {
                          if (iVar13 != 0) {
                            transpose_compute_A_tile_int8_scales
                                      (A,&local_228,fVar1,&local_188,iVar18,iVar16);
                            goto LAB_0047e9c6;
                          }
                          compute_A_tile_int8_scales(A,&local_228,fVar1,&local_188,iVar18,iVar16);
                        }
                        else if (iVar13 != 0) {
LAB_0047e9c6:
                          transpose_pack_A_tile_quantize
                                    (A,&m_2,iVar18,iVar16,iVar19,(int)max_kk,&local_228);
                          goto LAB_0047ea46;
                        }
                        pack_A_tile_quantize(A,&m_2,iVar18,iVar16,iVar19,(int)max_kk,&local_228);
                      }
LAB_0047ea46:
                      gemm_transB_packed_tile_int8
                                (&m_2,(Mat *)&TILE_M,&m_1,iVar18,iVar16,iVar31,iVar17,iVar19,
                                 (int)max_kk);
                      if (local_c0 != (int *)0x0) {
                        LOCK();
                        *local_c0 = *local_c0 + -1;
                        UNLOCK();
                        if (*local_c0 == 0) {
                          if (local_a8 == (Allocator *)0x0) {
                            free(_TILE_M);
                          }
                          else {
                            (*local_a8->_vptr_Allocator[3])();
                          }
                        }
                      }
                      if (m_2.refcount != (int *)0x0) {
                        LOCK();
                        *m_2.refcount = *m_2.refcount + -1;
                        UNLOCK();
                        if (*m_2.refcount == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            free(m_2.data);
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      fVar30 = (float)((int)fVar30 - (int)B_int8_scale);
                    }
                    unpack_output_tile_dequantize
                              (&m_1,&local_278,local_128,local_36c,iVar18,iVar16,iVar31,iVar17,
                               &local_188,(float)local_130,fVar10,(int)local_340);
                    iVar31 = iVar31 + (int)local_338;
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  iVar18 = (int)local_348 + 1;
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar32 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                free(local_188.data);
              }
              else {
                (*(local_188.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar32 == (int *)0x0) goto LAB_0047ed8d;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0047ed8d;
        if (local_228.allocator != (Allocator *)0x0) {
          (*(local_228.allocator)->_vptr_Allocator[3])();
          goto LAB_0047ed8d;
        }
      }
    }
    else {
      uVar28 = (this->super_Gemm).constantM;
      uVar15 = (ulong)uVar28;
      iVar18 = (this->super_Gemm).constantK;
      iVar13 = (this->super_Gemm).transB;
      if (iVar13 == 0) {
        iVar17 = A->w;
      }
      else {
        iVar17 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      iVar19 = (this->super_Gemm).output_transpose;
      fVar1 = (this->super_Gemm).alpha;
      fVar10 = (this->super_Gemm).beta;
      get_optimal_tile_mnk_int8
                (uVar28,iVar17,iVar18,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar16);
      local_340 = (long)(int)(uVar28 + TILE_M + -1) / (long)TILE_M & 0xffffffff;
      iVar16 = (TILE_N + iVar17 + -1) / TILE_N;
      iVar11 = (TILE_K + iVar18 + -1) / TILE_K;
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      Mat::create(&local_228,TILE_K * TILE_N,iVar11,iVar16,1,opt->workspace_allocator);
      iVar31 = -100;
      local_320 = uVar15;
      if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
        compute_B_int8_scale(A,&B_int8_scale);
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
        Mat::create(&local_188,(int)local_320,4,opt->workspace_allocator);
        iVar31 = -100;
        if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
          iVar16 = iVar16 * iVar11;
          pvVar4 = (this->super_Gemm).A_data_int8_scales.data;
          uVar15 = 0;
          uVar22 = 0;
          if (0 < (int)local_320) {
            uVar22 = local_320 & 0xffffffff;
          }
          for (; uVar22 != uVar15; uVar15 = uVar15 + 1) {
            *(float *)((long)local_188.data + uVar15 * 4) =
                 1.0 / (B_int8_scale * *(float *)((long)pvVar4 + uVar15 * 4));
          }
          iVar31 = 0;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          local_128 = pMVar3;
          for (; iVar26 = TILE_N, iVar16 != iVar31; iVar31 = iVar31 + 1) {
            iVar12 = TILE_N * (iVar31 / iVar11);
            iVar24 = TILE_K * (int)((long)iVar31 % (long)iVar11);
            iVar26 = iVar17 - iVar12;
            if (TILE_N < iVar17 - iVar12) {
              iVar26 = TILE_N;
            }
            iVar27 = iVar18 - iVar24;
            if (TILE_K < iVar18 - iVar24) {
              iVar27 = TILE_K;
            }
            m_3.cstep = (size_t)local_228.w;
            m_3.data = (void *)((long)local_228.data +
                               ((long)iVar31 % (long)iVar11 & 0xffffffffU) * m_3.cstep *
                               CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize) +
                               (long)(iVar31 / iVar11) * local_228.cstep *
                               CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize));
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_228.elemsize;
            m_3.elemsize._4_4_ = local_228.elemsize._4_4_;
            m_3.elempack = local_228.elempack;
            m_3.allocator = local_228.allocator;
            m_3.dims = 2;
            m_3.w = local_228.w;
            m_3.h = 1;
            m_3.d = 1;
            m_3.c = 1;
            if (iVar13 == 0) {
              transpose_pack_B_tile_quantize(A,&m_3,iVar12,iVar26,iVar24,iVar27,B_int8_scale);
            }
            else {
              pack_B_tile_quantize(A,&m_3,iVar12,iVar26,iVar24,iVar27,B_int8_scale);
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          iVar16 = TILE_M;
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,TILE_M * TILE_N,1,(int)local_348,4,opt->workspace_allocator);
          iVar31 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            iVar31 = (int)local_340;
            local_340 = local_340 & 0xffffffff;
            if (iVar31 < 1) {
              local_340 = 0;
            }
            for (uVar15 = 0; uVar15 != local_340; uVar15 = uVar15 + 1) {
              iVar13 = iVar16 * (int)uVar15;
              iVar31 = (int)local_320 - iVar13;
              if (iVar16 < iVar31) {
                iVar31 = iVar16;
              }
              iVar11 = get_omp_thread_num();
              uVar22 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
              m.data = (void *)((long)iVar11 * m_3.cstep * uVar22 + (long)m_3.data);
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)m_3.elemsize;
              m.elemsize._4_4_ = m_3.elemsize._4_4_;
              m.elempack = m_3.elempack;
              m.allocator = m_3.allocator;
              m.w = m_3.w;
              m.h = m_3.h;
              m.d = 1;
              m.c = m_3.d;
              m.dims = m_3.dims + -1;
              m.cstep = (uVar22 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar22;
              if (m_3.dims == 4) {
                m.cstep = (long)m_3.h * (long)m_3.w;
              }
              local_338 = uVar15;
              for (iVar11 = 0; uVar15 = local_338, iVar12 = iVar17 - iVar11,
                  iVar12 != 0 && iVar11 <= iVar17; iVar11 = iVar11 + iVar26) {
                if (iVar26 < iVar12) {
                  iVar12 = iVar26;
                }
                iVar24 = iVar18;
                for (iVar27 = 0; iVar27 < iVar18; iVar27 = iVar27 + TILE_K) {
                  iVar9 = iVar24;
                  if (TILE_K < iVar24) {
                    iVar9 = TILE_K;
                  }
                  sVar20 = (this->AT_data).elemsize;
                  m_1.w = (this->AT_data).w;
                  m_1.cstep = (size_t)m_1.w;
                  m_1.elempack = (this->AT_data).elempack;
                  m_1.allocator = (this->AT_data).allocator;
                  m_1.data = (void *)((long)(this->AT_data).data +
                                     sVar20 * m_1.cstep * (long)(iVar27 / TILE_K) +
                                     (this->AT_data).cstep * local_338 * sVar20);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)sVar20;
                  m_1.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
                  m_1.dims = 2;
                  m_1.h = 1;
                  m_1.d = 1;
                  m_1.c = 1;
                  m_2.cstep = (size_t)local_228.w;
                  m_2.elemsize = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                  m_2.data = (void *)((long)local_228.data +
                                     m_2.cstep * m_2.elemsize * (long)(iVar27 / TILE_K) +
                                     (long)(iVar11 / iVar26) * local_228.cstep * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.elempack = local_228.elempack;
                  m_2.allocator = local_228.allocator;
                  m_2.w = local_228.w;
                  m_2.h = 1;
                  m_2.d = 1;
                  m_2.dims = m_1.dims;
                  m_2.c = m_1.c;
                  gemm_transB_packed_tile_int8
                            (&m_1,&m_2,&m,iVar13,iVar31,iVar11,iVar12,iVar27,iVar9);
                  if (m_2.refcount != (int *)0x0) {
                    LOCK();
                    *m_2.refcount = *m_2.refcount + -1;
                    UNLOCK();
                    if (*m_2.refcount == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        free(m_2.data);
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  iVar24 = iVar24 - TILE_K;
                }
                unpack_output_tile_dequantize
                          (&m,&local_278,local_128,local_36c,iVar13,iVar31,iVar11,iVar12,&local_188,
                           fVar1,fVar10,iVar19);
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            iVar31 = 0;
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              free(local_188.data);
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar32 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar32 == (int *)0x0) goto LAB_0047ed8d;
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_0047ed8d;
      if (local_228.allocator != (Allocator *)0x0) {
        (*(local_228.allocator)->_vptr_Allocator[3])();
        goto LAB_0047ed8d;
      }
    }
  }
  else {
    fVar1 = (this->super_Gemm).B_data_int8_scale;
    uVar28 = (this->super_Gemm).constantM;
    iVar18 = (this->super_Gemm).constantN;
    iVar13 = (this->super_Gemm).constantK;
    iVar17 = (this->super_Gemm).output_transpose;
    fVar10 = (this->super_Gemm).alpha;
    local_320 = CONCAT44(local_320._4_4_,(this->super_Gemm).beta);
    get_optimal_tile_mnk_int8
              (uVar28,iVar18,iVar13,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,(int *)&m_2,
               &TILE_M,&TILE_N,iVar16);
    local_340 = (ulong)m_2.data & 0xffffffff;
    uVar15 = (long)(int)(uVar28 + (int)m_2.data + -1) / (long)(int)m_2.data;
    local_228.cstep = 0;
    local_228.data = (void *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize._0_4_ = 0;
    local_228.elemsize._4_4_ = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,uVar28,4,opt->workspace_allocator);
    iVar31 = -100;
    if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
      pvVar4 = (this->super_Gemm).A_data_int8_scales.data;
      uVar22 = 0;
      uVar21 = 0;
      if (0 < (int)uVar28) {
        uVar21 = (ulong)uVar28;
      }
      for (; uVar21 != uVar22; uVar22 = uVar22 + 1) {
        *(float *)((long)local_228.data + uVar22 * 4) =
             1.0 / (fVar1 * *(float *)((long)pvVar4 + uVar22 * 4));
      }
      iVar16 = TILE_M;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_M * (int)local_340,1,(int)local_348,4,opt->workspace_allocator);
      iVar31 = -100;
      if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
        iVar19 = TILE_N;
        local_130 = uVar15 & 0xffffffff;
        if ((int)uVar15 < 1) {
          local_130 = 0;
        }
        local_128 = pMVar3;
        for (uVar15 = 0; iVar31 = 0, uVar15 != local_130; uVar15 = uVar15 + 1) {
          iVar11 = (int)local_340;
          iVar31 = iVar11 * (int)uVar15;
          local_338 = CONCAT44(local_338._4_4_,iVar31);
          iVar31 = uVar28 - iVar31;
          if (iVar11 < iVar31) {
            iVar31 = iVar11;
          }
          iVar11 = get_omp_thread_num();
          uVar22 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          m_3.data = (void *)((long)iVar11 * local_188.cstep * uVar22 + (long)local_188.data);
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_188.elemsize;
          m_3.elemsize._4_4_ = local_188.elemsize._4_4_;
          m_3.elempack = local_188.elempack;
          m_3.allocator = local_188.allocator;
          m_3.w = local_188.w;
          m_3.h = local_188.h;
          m_3.d = 1;
          m_3.c = local_188.d;
          m_3.dims = local_188.dims + -1;
          m_3.cstep = (uVar22 * (long)local_188.h * (long)local_188.w + 0xf & 0xfffffffffffffff0) /
                      uVar22;
          if (local_188.dims == 4) {
            m_3.cstep = (long)local_188.h * (long)local_188.w;
          }
          for (iVar11 = 0; iVar26 = iVar18 - iVar11, iVar26 != 0 && iVar11 <= iVar18;
              iVar11 = iVar11 + iVar16) {
            if (iVar16 < iVar26) {
              iVar26 = iVar16;
            }
            iVar12 = iVar13;
            for (iVar24 = 0; iVar24 < iVar13; iVar24 = iVar24 + iVar19) {
              iVar27 = iVar12;
              if (iVar19 < iVar12) {
                iVar27 = iVar19;
              }
              sVar20 = (this->AT_data).elemsize;
              m.w = (this->AT_data).w;
              m.cstep = (size_t)m.w;
              m.elempack = (this->AT_data).elempack;
              m.allocator = (this->AT_data).allocator;
              m.data = (void *)((long)(this->AT_data).data +
                               sVar20 * m.cstep * (long)(iVar24 / iVar19) +
                               (this->AT_data).cstep * uVar15 * sVar20);
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)sVar20;
              m.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
              m_1.dims = 2;
              m.h = 1;
              m.d = 1;
              m_1.c = 1;
              m_1.w = (this->BT_data).w;
              m_1.cstep = (size_t)m_1.w;
              sVar20 = (this->BT_data).elemsize;
              m_1.elempack = (this->BT_data).elempack;
              m_1.data = (void *)((long)(this->BT_data).data +
                                 m_1.cstep * sVar20 * (long)(iVar24 / iVar19) +
                                 (long)(iVar11 / iVar16) * (this->BT_data).cstep * sVar20);
              m_1.allocator = (this->BT_data).allocator;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = (undefined4)sVar20;
              m_1.elemsize._4_4_ = (undefined4)(sVar20 >> 0x20);
              m_1.h = 1;
              m_1.d = 1;
              m.dims = m_1.dims;
              m.c = m_1.c;
              gemm_transB_packed_tile_int8
                        (&m,&m_1,&m_3,(int)local_338,iVar31,iVar11,iVar26,iVar24,iVar27);
              piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar12 = iVar12 - iVar19;
            }
            unpack_output_tile_dequantize
                      (&m_3,&local_278,local_128,local_36c,(int)local_338,iVar31,iVar11,iVar26,
                       &local_228,fVar10,(float)local_320,iVar17);
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
      piVar32 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            free(local_188.data);
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar32 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar32 == (int *)0x0) goto LAB_0047ed8d;
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 != 0) goto LAB_0047ed8d;
    if (local_228.allocator != (Allocator *)0x0) {
      (*(local_228.allocator)->_vptr_Allocator[3])();
      goto LAB_0047ed8d;
    }
  }
  free(local_228.data);
LAB_0047ed8d:
  piVar32 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        free(local_278.data);
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int Gemm_x86_avx::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}